

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestPhonySelfReferenceKept::Run(ParserTestPhonySelfReferenceKept *this)

{
  Test *pTVar1;
  bool bVar2;
  Edge *pEVar3;
  size_type sVar4;
  reference ppNVar5;
  Edge *edge;
  Node *local_f8;
  Node *node;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  string err;
  undefined1 local_90 [8];
  ManifestParser parser;
  ManifestParserOptions parser_opts;
  char kInput [18];
  ParserTestPhonySelfReferenceKept *this_local;
  
  parser_opts = (ManifestParserOptions)0x3a6120646c697562;
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)&parser.quiet_);
  parser._92_4_ = 1;
  err.field_2._12_4_ = kPhonyCycleActionError;
  err.field_2._8_4_ = parser._88_4_;
  ManifestParser::ManifestParser
            ((ManifestParser *)local_90,&(this->super_ParserTest).state,
             (FileReader *)&(this->super_ParserTest).fs_,(ManifestParserOptions)err.field_2._8_8_);
  std::__cxx11::string::string((string *)local_b8);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,(char *)&parser_opts,&local_d9);
  bVar2 = ManifestParser::ParseTest((ManifestParser *)local_90,&local_d8,(string *)local_b8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x196,"parser.ParseTest(kInput, &err)");
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x197,"\"\" == err");
  StringPiece::StringPiece((StringPiece *)&edge,"a");
  local_f8 = State::LookupNode(&(this->super_ParserTest).state,_edge);
  pEVar3 = Node::in_edge(local_f8);
  pTVar1 = g_current_test;
  sVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&pEVar3->inputs_);
  bVar2 = testing::Test::Check
                    (pTVar1,sVar4 == 1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                     ,0x19b,"edge->inputs_.size() == 1");
  pTVar1 = g_current_test;
  if (bVar2) {
    ppNVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&pEVar3->inputs_,0);
    bVar2 = testing::Test::Check
                      (pTVar1,*ppNVar5 == local_f8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x19c,"edge->inputs_[0] == node");
    if (!bVar2) {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_b8);
  return;
}

Assistant:

TEST_F(ParserTest, PhonySelfReferenceKept) {
  const char kInput[] =
"build a: phony a\n";
  ManifestParserOptions parser_opts;
  parser_opts.phony_cycle_action_ = kPhonyCycleActionError;
  ManifestParser parser(&state, &fs_, parser_opts);
  string err;
  EXPECT_TRUE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("", err);

  Node* node = state.LookupNode("a");
  Edge* edge = node->in_edge();
  ASSERT_EQ(edge->inputs_.size(), 1);
  ASSERT_EQ(edge->inputs_[0], node);
}